

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyNZ.hpp
# Opt level: O1

void njoy::ENDFtk::
     InterpolationSequenceRecord<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution>
     ::verifyNZ(uint index,uint NZ)

{
  undefined8 *puVar1;
  
  if (NZ == 0) {
    tools::Log::error<char_const*>("NZ should be larger than 0");
  }
  else {
    if (index == NZ) {
      return;
    }
    tools::Log::error<char_const*>
              ("Inconsistent NZ value between interpolation table and data points");
    tools::Log::info<char_const*,unsigned_int>("Last index interpolation table: {}",index);
    tools::Log::info<char_const*,unsigned_int>("Number of points in data: {}",NZ);
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifyNZ( unsigned int index, unsigned int NZ ) {

  if ( NZ == 0 ) {

    Log::error( "NZ should be larger than 0" );
    throw std::exception();
  }

  const bool inconsistentNZ = ( index != NZ );

  if ( inconsistentNZ ) {

    Log::error( "Inconsistent NZ value between interpolation table and "
                "data points" );
    Log::info( "Last index interpolation table: {}", index );
    Log::info( "Number of points in data: {}", NZ );
    throw std::exception();
  }
}